

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

Catalog * duckdb::Catalog::GetCatalog(CatalogEntryRetriever *retriever,string *catalog_name)

{
  Catalog *pCVar1;
  BinderException *this;
  allocator local_61;
  optional_ptr<duckdb::Catalog,_true> catalog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  catalog = GetCatalogEntry(retriever,catalog_name);
  if (catalog.ptr != (Catalog *)0x0) {
    pCVar1 = optional_ptr<duckdb::Catalog,_true>::operator*(&catalog);
    return pCVar1;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Catalog \"%s\" does not exist!",&local_61);
  ::std::__cxx11::string::string((string *)&local_58,(string *)catalog_name);
  BinderException::BinderException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Catalog &Catalog::GetCatalog(CatalogEntryRetriever &retriever, const string &catalog_name) {
	auto catalog = Catalog::GetCatalogEntry(retriever, catalog_name);
	if (!catalog) {
		throw BinderException("Catalog \"%s\" does not exist!", catalog_name);
	}
	return *catalog;
}